

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,capnp::Type&>
          (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> *this,
          ArrayPtr<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table,
          Type *params)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  HandlerBase *pHVar6;
  int iVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  HandlerBase *pHVar9;
  Entry *pEVar10;
  Type *in_R8;
  ulong uVar11;
  Maybe<unsigned_long> MVar12;
  
  pEVar10 = table.ptr;
  lVar1._0_2_ = pEVar10[1].key.baseType;
  lVar1._2_1_ = pEVar10[1].key.listDepth;
  lVar1._3_1_ = pEVar10[1].key.isImplicitParam;
  lVar1._4_2_ = pEVar10[1].key.field_3;
  lVar1._6_2_ = *(undefined2 *)&pEVar10[1].key.field_0x6;
  if (lVar1 == 0) {
    *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0;
    aVar8.value = table.size_;
  }
  else {
    uVar4 = capnp::Type::hashCode(in_R8);
    uVar5._0_2_ = pEVar10[1].key.baseType;
    uVar5._2_1_ = pEVar10[1].key.listDepth;
    uVar5._3_1_ = pEVar10[1].key.isImplicitParam;
    uVar5 = kj::_::chooseBucket((uint)(uVar4 != 0),uVar5);
    uVar11 = (ulong)uVar5;
    pHVar6 = pEVar10->value;
    iVar7 = *(int *)((long)&pHVar6[uVar11]._vptr_HandlerBase + 4);
    aVar8 = extraout_RDX;
    if (iVar7 != 0) {
      pHVar9 = pHVar6 + uVar11;
      do {
        if ((iVar7 != 1) && (*(uint *)&pHVar9->_vptr_HandlerBase == (uint)(uVar4 != 0))) {
          bVar3 = capnp::Type::operator==((Type *)(table.size_ + (ulong)(iVar7 - 2) * 0x18),in_R8);
          aVar8 = extraout_RDX_00;
          if (bVar3) {
            iVar7 = *(int *)((long)&pHVar9->_vptr_HandlerBase + 4);
            *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)
                    0x1;
            *(ulong *)(this + 8) = (ulong)(iVar7 - 2);
            goto LAB_001f073b;
          }
          pHVar6 = pEVar10->value;
        }
        uVar2._0_2_ = pEVar10[1].key.baseType;
        uVar2._2_1_ = pEVar10[1].key.listDepth;
        uVar2._3_1_ = pEVar10[1].key.isImplicitParam;
        uVar2._4_2_ = pEVar10[1].key.field_3;
        uVar2._6_2_ = *(undefined2 *)&pEVar10[1].key.field_0x6;
        if (uVar11 + 1 == uVar2) {
          uVar11 = 0;
        }
        else {
          uVar11 = uVar11 + 1 & 0xffffffff;
        }
        pHVar9 = pHVar6 + uVar11;
        iVar7 = *(int *)((long)&pHVar9->_vptr_HandlerBase + 4);
      } while (iVar7 != 0);
    }
    *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0;
  }
LAB_001f073b:
  MVar12.ptr.field_1.value = aVar8.value;
  MVar12.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar12.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }